

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_avx2.c
# Opt level: O3

void av1_highbd_dist_wtd_convolve_2d_avx2
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  undefined1 auVar5 [32];
  ushort uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int16_t *piVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  char cVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  long lVar30;
  byte bVar31;
  byte bVar32;
  uint uVar33;
  undefined1 (*pauVar34) [32];
  long lVar35;
  int iVar36;
  ulong uVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  undefined1 (*pauVar41) [16];
  undefined2 uVar42;
  int iVar43;
  undefined1 (*pauVar44) [32];
  int iVar45;
  undefined2 uVar46;
  int iVar47;
  int iVar48;
  undefined1 (*pauVar49) [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  int16_t im_block [1120];
  undefined1 (*local_b98) [32];
  undefined1 (*local_b80) [16];
  undefined1 (*local_b78) [16];
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [2176];
  undefined1 auVar53 [32];
  
  bVar31 = (byte)conv_params->round_0;
  cVar16 = (char)bd;
  iVar45 = conv_params->round_1 + conv_params->round_0;
  bVar32 = (cVar16 + '\x0e') - (char)iVar45;
  uVar42 = 0xff;
  if (bd == 0xc) {
    uVar42 = 0xfff;
  }
  uVar46 = 0x3ff;
  if (bd != 10) {
    uVar46 = uVar42;
  }
  if (0 < w) {
    uVar6 = filter_params_y->taps;
    piVar10 = filter_params_y->filter_ptr;
    uVar37 = (ulong)((subpel_y_qn & 0xfU) * (uint)uVar6);
    uVar1 = *(undefined4 *)(piVar10 + uVar37 + 6);
    uVar2 = *(undefined4 *)(piVar10 + uVar37 + 4);
    auVar55._4_4_ = uVar2;
    auVar55._0_4_ = uVar2;
    auVar55._8_4_ = uVar2;
    auVar55._12_4_ = uVar2;
    auVar55._16_4_ = uVar2;
    auVar55._20_4_ = uVar2;
    auVar55._24_4_ = uVar2;
    auVar55._28_4_ = uVar2;
    uVar2 = *(undefined4 *)(piVar10 + uVar37 + 2);
    uVar3 = *(undefined4 *)(piVar10 + uVar37);
    auVar56._4_4_ = uVar3;
    auVar56._0_4_ = uVar3;
    auVar56._8_4_ = uVar3;
    auVar56._12_4_ = uVar3;
    auVar56._16_4_ = uVar3;
    auVar56._20_4_ = uVar3;
    auVar56._24_4_ = uVar3;
    auVar56._28_4_ = uVar3;
    iVar38 = ((1 << (bVar31 & 0x1f)) >> 1) + (1 << (cVar16 + 6U & 0x1f));
    iVar47 = ((1 << ((byte)conv_params->round_1 & 0x1f)) >> 1) +
             (-1 << (~bVar31 + cVar16 + 0xe & 0x1f));
    local_b80 = (undefined1 (*) [16])conv_params->dst;
    iVar36 = (1 << (bVar32 - 1 & 0x1f)) + (1 << (bVar32 & 0x1f));
    uVar33 = 0xe - iVar45;
    iVar48 = h + (uint)uVar6 + -1;
    uVar37 = (ulong)((subpel_x_qn & 0xfU) * (uint)filter_params_x->taps);
    iVar45 = conv_params->fwd_offset;
    iVar4 = conv_params->bck_offset;
    auVar58._4_4_ = iVar38;
    auVar58._0_4_ = iVar38;
    auVar58._8_4_ = iVar38;
    auVar58._12_4_ = iVar38;
    auVar58._16_4_ = iVar38;
    auVar58._20_4_ = iVar38;
    auVar58._24_4_ = iVar38;
    auVar58._28_4_ = iVar38;
    uVar7 = conv_params->round_0;
    piVar10 = filter_params_x->filter_ptr;
    uVar3 = *(undefined4 *)(piVar10 + uVar37 + 6);
    auVar59._4_4_ = uVar3;
    auVar59._0_4_ = uVar3;
    auVar59._8_4_ = uVar3;
    auVar59._12_4_ = uVar3;
    auVar59._16_4_ = uVar3;
    auVar59._20_4_ = uVar3;
    auVar59._24_4_ = uVar3;
    auVar59._28_4_ = uVar3;
    uVar3 = *(undefined4 *)(piVar10 + uVar37 + 4);
    auVar60._4_4_ = uVar3;
    auVar60._0_4_ = uVar3;
    auVar60._8_4_ = uVar3;
    auVar60._12_4_ = uVar3;
    auVar60._16_4_ = uVar3;
    auVar60._20_4_ = uVar3;
    auVar60._24_4_ = uVar3;
    auVar60._28_4_ = uVar3;
    uVar3 = *(undefined4 *)(piVar10 + uVar37 + 2);
    auVar62._4_4_ = uVar3;
    auVar62._0_4_ = uVar3;
    auVar62._8_4_ = uVar3;
    auVar62._12_4_ = uVar3;
    auVar62._16_4_ = uVar3;
    auVar62._20_4_ = uVar3;
    auVar62._24_4_ = uVar3;
    auVar62._28_4_ = uVar3;
    uVar3 = *(undefined4 *)(piVar10 + uVar37);
    auVar61._4_4_ = uVar3;
    auVar61._0_4_ = uVar3;
    auVar61._8_4_ = uVar3;
    auVar61._12_4_ = uVar3;
    auVar61._16_4_ = uVar3;
    auVar61._20_4_ = uVar3;
    auVar61._24_4_ = uVar3;
    auVar61._28_4_ = uVar3;
    lVar39 = (long)conv_params->dst_stride;
    iVar38 = conv_params->do_average;
    iVar43 = ((1 << ((byte)uVar33 & 0x1f)) >> 1) - iVar36;
    iVar8 = conv_params->use_dist_wtd_comp_avg;
    lVar30 = (long)dst_stride0;
    local_b98 = (undefined1 (*) [32])
                ((long)src +
                (2 - ((long)(int)(((uVar6 >> 1) - 1) * src_stride) * 2 +
                     (ulong)(filter_params_x->taps >> 1) * 2)));
    uVar37 = 0;
    uVar9 = conv_params->round_1;
    local_b78 = (undefined1 (*) [16])dst0;
    do {
      if (0 < iVar48) {
        pauVar34 = (undefined1 (*) [32])local_920;
        lVar35 = 1;
        pauVar44 = local_b98;
        do {
          auVar50 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          if (lVar35 < iVar48) {
            auVar50 = *(undefined1 (*) [32])(*pauVar44 + (long)src_stride * 2);
          }
          auVar5 = *pauVar44;
          auVar51._0_16_ = ZEXT116(0) * auVar50._0_16_ + ZEXT116(1) * auVar5._0_16_;
          auVar51._16_16_ = ZEXT116(0) * auVar5._16_16_ + ZEXT116(1) * auVar50._0_16_;
          auVar15 = vperm2i128_avx2(auVar5,auVar50,0x31);
          auVar50 = vpalignr_avx2(auVar15,auVar51,4);
          auVar5 = vpalignr_avx2(auVar15,auVar51,8);
          auVar11 = vpalignr_avx2(auVar15,auVar51,0xc);
          auVar12 = vpmaddwd_avx2(auVar61,auVar51);
          auVar13 = vpmaddwd_avx2(auVar62,auVar50);
          auVar50 = vpmaddwd_avx2(auVar60,auVar5);
          auVar5 = vpmaddwd_avx2(auVar59,auVar11);
          auVar50 = vpaddd_avx2(auVar50,auVar5);
          auVar5 = vpaddd_avx2(auVar58,auVar12);
          auVar5 = vpaddd_avx2(auVar5,auVar13);
          auVar50 = vpaddd_avx2(auVar5,auVar50);
          auVar50 = vpsrad_avx2(auVar50,ZEXT416(uVar7));
          auVar50 = vpackssdw_avx2(auVar50,auVar15);
          auVar5 = vpalignr_avx2(auVar15,auVar51,2);
          auVar11 = vpalignr_avx2(auVar15,auVar51,6);
          auVar12 = vpalignr_avx2(auVar15,auVar51,10);
          auVar13 = vpalignr_avx2(auVar15,auVar51,0xe);
          auVar15 = vpmaddwd_avx2(auVar61,auVar5);
          auVar5 = vpmaddwd_avx2(auVar62,auVar11);
          auVar11 = vpmaddwd_avx2(auVar60,auVar12);
          auVar5 = vpaddd_avx2(auVar5,auVar11);
          auVar12 = vpmaddwd_avx2(auVar59,auVar13);
          auVar11 = vpaddd_avx2(auVar58,auVar15);
          auVar5 = vpaddd_avx2(auVar11,auVar5);
          auVar5 = vpaddd_avx2(auVar5,auVar12);
          auVar5 = vpsrad_avx2(auVar5,ZEXT416(uVar7));
          auVar5 = vpackssdw_avx2(auVar5,auVar5);
          auVar50 = vpunpcklwd_avx2(auVar50,auVar5);
          *pauVar34 = auVar50;
          pauVar44 = (undefined1 (*) [32])(*pauVar44 + (long)src_stride * 4);
          pauVar34 = pauVar34 + 1;
          lVar40 = lVar35 + 1;
          lVar35 = lVar35 + 2;
        } while (lVar40 < iVar48);
      }
      if (0 < h) {
        auVar12._16_16_ = auStack_8d0;
        auVar12._0_16_ = local_8e0;
        auVar29._16_16_ = local_8c0;
        auVar29._0_16_ = auStack_8d0;
        auVar11 = vpunpckhwd_avx2(auVar12,auVar29);
        auVar15._16_16_ = auStack_8f0;
        auVar15._0_16_ = local_900;
        auVar28._16_16_ = local_8e0;
        auVar28._0_16_ = auStack_8f0;
        auVar50 = vpunpckhwd_avx2(auVar15,auVar28);
        auVar13._16_16_ = auStack_910;
        auVar13._0_16_ = local_920;
        auVar14._16_16_ = local_900;
        auVar14._0_16_ = auStack_910;
        auVar5 = vpunpckhwd_avx2(auVar13,auVar14);
        auVar12 = vpunpcklwd_avx2(auVar12,auVar29);
        auVar15 = vpunpcklwd_avx2(auVar15,auVar28);
        auVar13 = vpunpcklwd_avx2(auVar13,auVar14);
        pauVar34 = (undefined1 (*) [32])auStack_8b0;
        lVar35 = 0;
        pauVar41 = local_b78;
        pauVar49 = local_b80;
        do {
          auVar29 = auVar50;
          auVar28 = auVar12;
          auVar12 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar34[-1] + 0x10),*pauVar34);
          auVar14 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar34[-1] + 0x10),*pauVar34);
          auVar26._4_4_ = uVar2;
          auVar26._0_4_ = uVar2;
          auVar26._8_4_ = uVar2;
          auVar26._12_4_ = uVar2;
          auVar26._16_4_ = uVar2;
          auVar26._20_4_ = uVar2;
          auVar26._24_4_ = uVar2;
          auVar26._28_4_ = uVar2;
          auVar50 = vpmaddwd_avx2(auVar15,auVar26);
          auVar51 = vpmaddwd_avx2(auVar28,auVar55);
          auVar50 = vpaddd_avx2(auVar51,auVar50);
          auVar13 = vpmaddwd_avx2(auVar56,auVar13);
          auVar17._4_4_ = iVar47;
          auVar17._0_4_ = iVar47;
          auVar17._8_4_ = iVar47;
          auVar17._12_4_ = iVar47;
          auVar17._16_4_ = iVar47;
          auVar17._20_4_ = iVar47;
          auVar17._24_4_ = iVar47;
          auVar17._28_4_ = iVar47;
          auVar13 = vpaddd_avx2(auVar17,auVar13);
          auVar50 = vpaddd_avx2(auVar13,auVar50);
          auVar27._4_4_ = uVar1;
          auVar27._0_4_ = uVar1;
          auVar27._8_4_ = uVar1;
          auVar27._12_4_ = uVar1;
          auVar27._16_4_ = uVar1;
          auVar27._20_4_ = uVar1;
          auVar27._24_4_ = uVar1;
          auVar27._28_4_ = uVar1;
          auVar13 = vpmaddwd_avx2(auVar12,auVar27);
          auVar50 = vpaddd_avx2(auVar50,auVar13);
          auVar50 = vpsrad_avx2(auVar50,ZEXT416(uVar9));
          auVar25._4_4_ = iVar36;
          auVar25._0_4_ = iVar36;
          auVar25._8_4_ = iVar36;
          auVar25._12_4_ = iVar36;
          auVar25._16_4_ = iVar36;
          auVar25._20_4_ = iVar36;
          auVar25._24_4_ = iVar36;
          auVar25._28_4_ = iVar36;
          auVar50 = vpaddd_avx2(auVar50,auVar25);
          if ((long)((ulong)(uint)w - 8) < (long)uVar37) {
            if (iVar38 == 0) {
              auVar50 = vpackusdw_avx2(auVar50,auVar15);
              *(long *)*pauVar49 = auVar50._0_8_;
              *(long *)(*pauVar49 + lVar39 * 2) = auVar50._16_8_;
            }
            else {
              auVar52._8_8_ = 0;
              auVar52._0_8_ = *(ulong *)(*pauVar49 + lVar39 * 2);
              auVar54._8_8_ = 0;
              auVar54._0_8_ = *(ulong *)*pauVar49;
              auVar53._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar54;
              auVar53._16_16_ = ZEXT116(1) * auVar52;
              auVar5 = vpunpcklwd_avx2(auVar53,_DAT_0050f2c0);
              if (iVar8 == 0) {
                auVar50 = vpaddd_avx2(auVar50,auVar5);
                auVar50 = vpsrad_avx2(auVar50,1);
              }
              else {
                auVar20._4_4_ = iVar45;
                auVar20._0_4_ = iVar45;
                auVar20._8_4_ = iVar45;
                auVar20._12_4_ = iVar45;
                auVar20._16_4_ = iVar45;
                auVar20._20_4_ = iVar45;
                auVar20._24_4_ = iVar45;
                auVar20._28_4_ = iVar45;
                auVar5 = vpmulld_avx2(auVar5,auVar20);
                auVar18._4_4_ = iVar4;
                auVar18._0_4_ = iVar4;
                auVar18._8_4_ = iVar4;
                auVar18._12_4_ = iVar4;
                auVar18._16_4_ = iVar4;
                auVar18._20_4_ = iVar4;
                auVar18._24_4_ = iVar4;
                auVar18._28_4_ = iVar4;
                auVar50 = vpmulld_avx2(auVar50,auVar18);
                auVar50 = vpaddd_avx2(auVar5,auVar50);
                auVar50 = vpsrad_avx2(auVar50,4);
              }
              auVar22._4_4_ = iVar43;
              auVar22._0_4_ = iVar43;
              auVar22._8_4_ = iVar43;
              auVar22._12_4_ = iVar43;
              auVar22._16_4_ = iVar43;
              auVar22._20_4_ = iVar43;
              auVar22._24_4_ = iVar43;
              auVar22._28_4_ = iVar43;
              auVar50 = vpaddd_avx2(auVar50,auVar22);
              auVar50 = vpsrad_avx2(auVar50,ZEXT416(uVar33));
              auVar50 = vpackusdw_avx2(auVar50,auVar50);
              auVar24._2_2_ = uVar46;
              auVar24._0_2_ = uVar46;
              auVar24._4_2_ = uVar46;
              auVar24._6_2_ = uVar46;
              auVar24._8_2_ = uVar46;
              auVar24._10_2_ = uVar46;
              auVar24._12_2_ = uVar46;
              auVar24._14_2_ = uVar46;
              auVar24._16_2_ = uVar46;
              auVar24._18_2_ = uVar46;
              auVar24._20_2_ = uVar46;
              auVar24._22_2_ = uVar46;
              auVar24._24_2_ = uVar46;
              auVar24._26_2_ = uVar46;
              auVar24._28_2_ = uVar46;
              auVar24._30_2_ = uVar46;
              auVar50 = vpminsw_avx2(auVar50,auVar24);
              *(long *)*pauVar41 = auVar50._0_8_;
              *(long *)((long)*pauVar41 + lVar30 * 2) = auVar50._16_8_;
            }
          }
          else {
            auVar13 = vpmaddwd_avx2(auVar56,auVar5);
            auVar5 = vpmaddwd_avx2(auVar29,auVar26);
            auVar51 = vpmaddwd_avx2(auVar11,auVar55);
            auVar5 = vpaddd_avx2(auVar51,auVar5);
            auVar51 = vpmaddwd_avx2(auVar14,auVar27);
            auVar13 = vpaddd_avx2(auVar17,auVar13);
            auVar5 = vpaddd_avx2(auVar13,auVar5);
            auVar5 = vpaddd_avx2(auVar51,auVar5);
            auVar5 = vpsrad_avx2(auVar5,ZEXT416(uVar9));
            auVar5 = vpaddd_avx2(auVar25,auVar5);
            if (iVar38 == 0) {
              auVar50 = vpackusdw_avx2(auVar50,auVar5);
              *pauVar49 = auVar50._0_16_;
              *(undefined1 (*) [16])(*pauVar49 + lVar39 * 2) = auVar50._16_16_;
            }
            else {
              auVar57._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])(*pauVar49 + lVar39 * 2) +
                   ZEXT116(1) * *pauVar49;
              auVar57._16_16_ = ZEXT116(1) * *(undefined1 (*) [16])(*pauVar49 + lVar39 * 2);
              auVar51 = vpunpcklwd_avx2(auVar57,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
              auVar13 = vpunpckhwd_avx2(auVar57,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
              if (iVar8 == 0) {
                auVar50 = vpaddd_avx2(auVar50,auVar51);
                auVar51 = vpsrad_avx2(auVar50,1);
                auVar50 = vpaddd_avx2(auVar13,auVar5);
                auVar50 = vpsrad_avx2(auVar50,1);
              }
              else {
                auVar21._4_4_ = iVar45;
                auVar21._0_4_ = iVar45;
                auVar21._8_4_ = iVar45;
                auVar21._12_4_ = iVar45;
                auVar21._16_4_ = iVar45;
                auVar21._20_4_ = iVar45;
                auVar21._24_4_ = iVar45;
                auVar21._28_4_ = iVar45;
                auVar51 = vpmulld_avx2(auVar21,auVar51);
                auVar19._4_4_ = iVar4;
                auVar19._0_4_ = iVar4;
                auVar19._8_4_ = iVar4;
                auVar19._12_4_ = iVar4;
                auVar19._16_4_ = iVar4;
                auVar19._20_4_ = iVar4;
                auVar19._24_4_ = iVar4;
                auVar19._28_4_ = iVar4;
                auVar50 = vpmulld_avx2(auVar50,auVar19);
                auVar50 = vpaddd_avx2(auVar51,auVar50);
                auVar51 = vpsrad_avx2(auVar50,4);
                auVar50 = vpmulld_avx2(auVar21,auVar13);
                auVar5 = vpmulld_avx2(auVar5,auVar19);
                auVar50 = vpaddd_avx2(auVar50,auVar5);
                auVar50 = vpsrad_avx2(auVar50,4);
              }
              auVar23._4_4_ = iVar43;
              auVar23._0_4_ = iVar43;
              auVar23._8_4_ = iVar43;
              auVar23._12_4_ = iVar43;
              auVar23._16_4_ = iVar43;
              auVar23._20_4_ = iVar43;
              auVar23._24_4_ = iVar43;
              auVar23._28_4_ = iVar43;
              auVar5 = vpaddd_avx2(auVar23,auVar51);
              auVar5 = vpsrad_avx2(auVar5,ZEXT416(uVar33));
              auVar50 = vpaddd_avx2(auVar23,auVar50);
              auVar50 = vpsrad_avx2(auVar50,ZEXT416(uVar33));
              auVar50 = vpackusdw_avx2(auVar5,auVar50);
              auVar5._2_2_ = uVar46;
              auVar5._0_2_ = uVar46;
              auVar5._4_2_ = uVar46;
              auVar5._6_2_ = uVar46;
              auVar5._8_2_ = uVar46;
              auVar5._10_2_ = uVar46;
              auVar5._12_2_ = uVar46;
              auVar5._14_2_ = uVar46;
              auVar5._16_2_ = uVar46;
              auVar5._18_2_ = uVar46;
              auVar5._20_2_ = uVar46;
              auVar5._22_2_ = uVar46;
              auVar5._24_2_ = uVar46;
              auVar5._26_2_ = uVar46;
              auVar5._28_2_ = uVar46;
              auVar5._30_2_ = uVar46;
              auVar50 = vpminsw_avx2(auVar50,auVar5);
              *pauVar41 = auVar50._0_16_;
              *(undefined1 (*) [16])((long)*pauVar41 + lVar30 * 2) = auVar50._16_16_;
            }
          }
          lVar35 = lVar35 + 2;
          pauVar49 = (undefined1 (*) [16])(*pauVar49 + lVar39 * 4);
          pauVar41 = (undefined1 (*) [16])((long)*pauVar41 + lVar30 * 2 * 2);
          pauVar34 = pauVar34 + 1;
          auVar50 = auVar11;
          auVar11 = auVar14;
          auVar13 = auVar15;
          auVar15 = auVar28;
          auVar5 = auVar29;
        } while (lVar35 < h);
      }
      uVar37 = uVar37 + 8;
      local_b98 = (undefined1 (*) [32])(*local_b98 + 0x10);
      local_b80 = local_b80 + 1;
      local_b78 = local_b78 + 1;
    } while (uVar37 < (uint)w);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_avx2(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params, int bd) {
  DECLARE_ALIGNED(32, int16_t, im_block[(MAX_SB_SIZE + MAX_FILTER_TAP) * 8]);
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = 8;
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  __m256i s[8], coeffs_y[4], coeffs_x[4];
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);
  const __m256i zero = _mm256_setzero_si256();

  const __m256i round_const_x = _mm256_set1_epi32(
      ((1 << conv_params->round_0) >> 1) + (1 << (bd + FILTER_BITS - 1)));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);

  const __m256i round_const_y = _mm256_set1_epi32(
      ((1 << conv_params->round_1) >> 1) -
      (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
  const __m128i round_shift_y = _mm_cvtsi32_si128(conv_params->round_1);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi32((1 << rounding_shift) >> 1);

  const __m256i clip_pixel_to_bd =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);
  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    {
      for (i = 0; i < im_h; i += 2) {
        const __m256i row0 =
            _mm256_loadu_si256((__m256i *)&src_ptr[i * src_stride + j]);
        __m256i row1 = _mm256_setzero_si256();
        if (i + 1 < im_h)
          row1 =
              _mm256_loadu_si256((__m256i *)&src_ptr[(i + 1) * src_stride + j]);

        const __m256i r0 = _mm256_permute2x128_si256(row0, row1, 0x20);
        const __m256i r1 = _mm256_permute2x128_si256(row0, row1, 0x31);

        // even pixels
        s[0] = _mm256_alignr_epi8(r1, r0, 0);
        s[1] = _mm256_alignr_epi8(r1, r0, 4);
        s[2] = _mm256_alignr_epi8(r1, r0, 8);
        s[3] = _mm256_alignr_epi8(r1, r0, 12);

        __m256i res_even = convolve(s, coeffs_x);
        res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_x),
                                    round_shift_x);

        // odd pixels
        s[0] = _mm256_alignr_epi8(r1, r0, 2);
        s[1] = _mm256_alignr_epi8(r1, r0, 6);
        s[2] = _mm256_alignr_epi8(r1, r0, 10);
        s[3] = _mm256_alignr_epi8(r1, r0, 14);

        __m256i res_odd = convolve(s, coeffs_x);
        res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_x),
                                   round_shift_x);

        __m256i res_even1 = _mm256_packs_epi32(res_even, res_even);
        __m256i res_odd1 = _mm256_packs_epi32(res_odd, res_odd);
        __m256i res = _mm256_unpacklo_epi16(res_even1, res_odd1);

        _mm256_store_si256((__m256i *)&im_block[i * im_stride], res);
      }
    }

    /* Vertical filter */
    {
      __m256i s0 = _mm256_loadu_si256((__m256i *)(im_block + 0 * im_stride));
      __m256i s1 = _mm256_loadu_si256((__m256i *)(im_block + 1 * im_stride));
      __m256i s2 = _mm256_loadu_si256((__m256i *)(im_block + 2 * im_stride));
      __m256i s3 = _mm256_loadu_si256((__m256i *)(im_block + 3 * im_stride));
      __m256i s4 = _mm256_loadu_si256((__m256i *)(im_block + 4 * im_stride));
      __m256i s5 = _mm256_loadu_si256((__m256i *)(im_block + 5 * im_stride));

      s[0] = _mm256_unpacklo_epi16(s0, s1);
      s[1] = _mm256_unpacklo_epi16(s2, s3);
      s[2] = _mm256_unpacklo_epi16(s4, s5);

      s[4] = _mm256_unpackhi_epi16(s0, s1);
      s[5] = _mm256_unpackhi_epi16(s2, s3);
      s[6] = _mm256_unpackhi_epi16(s4, s5);

      for (i = 0; i < h; i += 2) {
        const int16_t *data = &im_block[i * im_stride];

        const __m256i s6 =
            _mm256_loadu_si256((__m256i *)(data + 6 * im_stride));
        const __m256i s7 =
            _mm256_loadu_si256((__m256i *)(data + 7 * im_stride));

        s[3] = _mm256_unpacklo_epi16(s6, s7);
        s[7] = _mm256_unpackhi_epi16(s6, s7);

        const __m256i res_a = convolve(s, coeffs_y);

        const __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_y), round_shift_y);

        const __m256i res_unsigned_lo =
            _mm256_add_epi32(res_a_round, offset_const);

        if (w - j < 8) {
          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadl_epi64(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0 = _mm256_unpacklo_epi16(data_01, zero);

            const __m256i comp_avg_res =
                highbd_comp_avg(&data_ref_0, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result = highbd_convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result, round_result);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            __m256i res_16b =
                _mm256_packus_epi32(res_unsigned_lo, res_unsigned_lo);
            const __m128i res_0 = _mm256_castsi256_si128(res_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                             res_1);
          }
        } else {
          const __m256i res_b = convolve(s + 4, coeffs_y);
          const __m256i res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b, round_const_y), round_shift_y);

          __m256i res_unsigned_hi = _mm256_add_epi32(res_b_round, offset_const);

          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadu_si128(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_01, zero);
            const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_01, zero);

            const __m256i comp_avg_res_lo =
                highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);
            const __m256i comp_avg_res_hi =
                highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result_lo =
                highbd_convolve_rounding(&comp_avg_res_lo, &offset_const,
                                         &rounding_const, rounding_shift);
            const __m256i round_result_hi =
                highbd_convolve_rounding(&comp_avg_res_hi, &offset_const,
                                         &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result_lo, round_result_hi);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_store_si128(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            __m256i res_16b =
                _mm256_packus_epi32(res_unsigned_lo, res_unsigned_hi);
            const __m128i res_0 = _mm256_castsi256_si128(res_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        }

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}